

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  bool bVar2;
  value_type vVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  value_type *pvVar7;
  ulong uVar8;
  size_t sVar9;
  value_type vVar10;
  value_type *pvVar11;
  long lVar12;
  value_type avStack_28 [32];
  
  uVar6 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar4 = (long)iVar1;
  pvVar11 = avStack_28 + lVar4;
  uVar8 = uVar6;
  if (99 < uVar6) {
    do {
      uVar6 = uVar8 / 100;
      *(undefined2 *)(pvVar11 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar8 + (int)uVar6 * -100) * 2)
      ;
      pvVar11 = pvVar11 + -2;
      bVar2 = 9999 < uVar8;
      uVar8 = uVar6;
    } while (bVar2);
  }
  pvVar7 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar8 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar9 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar10 = it->blackhole_;
  if (uVar6 < 10) {
    bVar5 = (byte)uVar6 | 0x30;
    lVar12 = -1;
  }
  else {
    pvVar11[-1] = internal::basic_data<void>::DIGITS[(uVar6 * 2 & 0xffffffff) + 1];
    bVar5 = internal::basic_data<void>::DIGITS[uVar6 * 2 & 0x1fffffffe];
    lVar12 = -2;
  }
  pvVar11[lVar12] = bVar5;
  if (0 < iVar1) {
    lVar12 = 0;
    do {
      vVar3 = avStack_28[lVar12];
      if (sVar9 + lVar12 < uVar8) {
        *pvVar7 = avStack_28[lVar12];
        pvVar7 = pvVar7 + 1;
        vVar3 = vVar10;
      }
      vVar10 = vVar3;
      lVar12 = lVar12 + 1;
    } while (lVar4 != lVar12);
    sVar9 = sVar9 + lVar4;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar7;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar8;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar9;
  it->blackhole_ = vVar10;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }